

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O2

void __thiscall amrex::Amr::setRecordRunInfoTerse(Amr *this,string *filename)

{
  allocator local_31;
  string local_30;
  
  this->record_run_info_terse = 1;
  if (*(int *)(ParallelContext::frames + 0xc) == 0) {
    std::ofstream::open((char *)&this->runlog_terse,(_Ios_Openmode)(filename->_M_dataplus)._M_p);
    if (*(int *)(&this->field_0x6f0 + *(long *)(*(long *)&this->runlog_terse + -0x18)) != 0) {
      FileOpenFailed(filename);
    }
  }
  std::__cxx11::string::string((string *)&local_30,"Amr::setRecordRunInfoTerse",&local_31);
  ParallelDescriptor::Barrier(&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void
Amr::setRecordRunInfoTerse (const std::string& filename)
{
    record_run_info_terse = true;
    if (ParallelDescriptor::IOProcessor())
    {
        runlog_terse.open(filename.c_str(),std::ios::out|std::ios::app);
        if (!runlog_terse.good()) {
            amrex::FileOpenFailed(filename);
        }
    }
    ParallelDescriptor::Barrier("Amr::setRecordRunInfoTerse");
}